

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

CURLcode Curl_proxy_connect(Curl_easy *data,int sockindex)

{
  connectdata *conn;
  CURLcode CVar1;
  uint uVar2;
  char *hostname;
  _Bool *done;
  
  conn = data->conn;
  if (((conn->http_proxy).proxytype == '\x02') &&
     ((conn->bits).proxy_ssl_connected[sockindex] == false)) {
    done = (conn->bits).proxy_ssl_connected + sockindex;
    CVar1 = Curl_ssl_connect_nonblocking(data,conn,true,sockindex,done);
    if (CVar1 != CURLE_OK) {
      Curl_conncontrol(conn,1);
      return CVar1;
    }
    if ((*done & 1U) == 0) {
      return CURLE_OK;
    }
  }
  uVar2 = *(uint *)&(conn->bits).field_0x4;
  if ((~uVar2 & 9) != 0) {
    return CURLE_OK;
  }
  if ((uVar2 >> 9 & 1) == 0) {
    if (sockindex == 1) {
      hostname = conn->secondaryhostname;
LAB_00603e70:
      uVar2 = (uint)conn->secondary_port;
      goto LAB_00603e97;
    }
    hostname = (conn->host).name;
  }
  else {
    hostname = (conn->conn_to_host).name;
    if (sockindex == 1) goto LAB_00603e70;
  }
  if ((uVar2 >> 10 & 1) == 0) {
    uVar2 = conn->remote_port;
  }
  else {
    uVar2 = conn->conn_to_port;
  }
LAB_00603e97:
  CVar1 = Curl_proxyCONNECT(data,sockindex,hostname,uVar2);
  if (CVar1 == CURLE_OK) {
    (*Curl_cfree)((data->state).aptr.proxyuserpwd);
    (data->state).aptr.proxyuserpwd = (char *)0x0;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_proxy_connect(struct Curl_easy *data, int sockindex)
{
  struct connectdata *conn = data->conn;
  if(conn->http_proxy.proxytype == CURLPROXY_HTTPS) {
    const CURLcode result = https_proxy_connect(data, sockindex);
    if(result)
      return result;
    if(!conn->bits.proxy_ssl_connected[sockindex])
      return result; /* wait for HTTPS proxy SSL initialization to complete */
  }

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy) {
#ifndef CURL_DISABLE_PROXY
    /* for [protocol] tunneled through HTTP proxy */
    const char *hostname;
    int remote_port;
    CURLcode result;

    /* We want "seamless" operations through HTTP proxy tunnel */

    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */

    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else if(sockindex == SECONDARYSOCKET)
      hostname = conn->secondaryhostname;
    else
      hostname = conn->host.name;

    if(sockindex == SECONDARYSOCKET)
      remote_port = conn->secondary_port;
    else if(conn->bits.conn_to_port)
      remote_port = conn->conn_to_port;
    else
      remote_port = conn->remote_port;

    result = Curl_proxyCONNECT(data, sockindex, hostname, remote_port);
    if(CURLE_OK != result)
      return result;
    Curl_safefree(data->state.aptr.proxyuserpwd);
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  /* no HTTP tunnel proxy, just return */
  return CURLE_OK;
}